

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall mjs::print_visitor::operator()(print_visitor *this,array_literal_expression *e)

{
  wostream *pwVar1;
  long *plVar2;
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> e_00;
  char *pcVar3;
  pointer puVar4;
  ulong uVar5;
  wchar_t local_30;
  wchar_t local_2c;
  
  pwVar1 = this->os_;
  plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    local_30 = (**(code **)(*plVar2 + 0x50))(plVar2,0x5b);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_30,1);
    if ((e->elements_).
        super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (e->elements_).
        super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        pcVar3 = "], ";
        if (uVar5 == 0) {
          pcVar3 = "\t";
        }
        std::operator<<(this->os_,pcVar3 + 1);
        puVar4 = (e->elements_).
                 super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        e_00._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
             puVar4[uVar5]._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t;
        if ((_Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>)
            e_00._M_t.
            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
            super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
          accept<mjs::print_visitor>
                    ((expression *)
                     e_00._M_t.
                     super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                     .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
          puVar4 = (e->elements_).
                   super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)(e->elements_).
                                     super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)
              );
    }
    pwVar1 = this->os_;
    plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      local_2c = (**(code **)(*plVar2 + 0x50))(plVar2,0x5d);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_2c,1);
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const array_literal_expression& e) {
        os_ << '[';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            os_ << (i ? ", " : "");
            if (es[i]) {
                accept(*es[i], *this);
            }
        }
        os_ << ']';
    }